

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

int __thiscall
icu_63::TimeZoneGenericNames::clone
          (TimeZoneGenericNames *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneGenericNames *this_00;
  TimeZoneGenericNames *local_38;
  TimeZoneGenericNames *other;
  TimeZoneGenericNames *this_local;
  
  this_00 = (TimeZoneGenericNames *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  local_38 = (TimeZoneGenericNames *)0x0;
  if (this_00 != (TimeZoneGenericNames *)0x0) {
    TimeZoneGenericNames(this_00);
    local_38 = this_00;
  }
  if (local_38 != (TimeZoneGenericNames *)0x0) {
    umtx_lock_63((UMutex *)gTZGNLock);
    this->fRef->refCount = this->fRef->refCount + 1;
    local_38->fRef = this->fRef;
    umtx_unlock_63((UMutex *)gTZGNLock);
  }
  return (int)local_38;
}

Assistant:

TimeZoneGenericNames*
TimeZoneGenericNames::clone() const {
    TimeZoneGenericNames* other = new TimeZoneGenericNames();
    if (other) {
        umtx_lock(&gTZGNLock);
        {
            // Just increments the reference count
            fRef->refCount++;
            other->fRef = fRef;
        }
        umtx_unlock(&gTZGNLock);
    }
    return other;
}